

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O2

void __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::CloneTopOperand
          (GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,
          Stack<rapidjson::CrtAllocator> *operandStack)

{
  undefined4 uVar1;
  undefined4 uVar2;
  SizeType index;
  SizeType SVar3;
  int iVar4;
  Frag *pFVar5;
  State *__dest;
  State *__src;
  size_t sVar6;
  size_t __n;
  uint uVar7;
  undefined8 local_48;
  
  pFVar5 = Stack<rapidjson::CrtAllocator>::
           Top<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                     (operandStack);
  uVar1 = pFVar5->start;
  uVar2 = pFVar5->out;
  index = pFVar5->minIndex;
  SVar3 = this->stateCount_;
  uVar7 = SVar3 - index;
  __dest = Stack<rapidjson::CrtAllocator>::
           Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::State>
                     (&this->states_,(ulong)uVar7);
  __src = GetState(this,index);
  __n = (ulong)uVar7 << 4;
  memcpy(__dest,__src,__n);
  for (sVar6 = 0; __n != sVar6; sVar6 = sVar6 + 0x10) {
    iVar4 = *(int *)((long)&__dest->out + sVar6);
    if (iVar4 != -1) {
      *(uint *)((long)&__dest->out + sVar6) = iVar4 + uVar7;
    }
    iVar4 = *(int *)((long)&__dest->out1 + sVar6);
    if (iVar4 != -1) {
      *(uint *)((long)&__dest->out1 + sVar6) = iVar4 + uVar7;
    }
  }
  pFVar5 = Stack<rapidjson::CrtAllocator>::
           Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                     (operandStack,1);
  pFVar5->start = uVar7 + uVar1;
  pFVar5->out = uVar7 + uVar2;
  pFVar5->minIndex = SVar3;
  this->stateCount_ = this->stateCount_ + uVar7;
  return;
}

Assistant:

void CloneTopOperand(Stack<Allocator>& operandStack) {
        const Frag src = *operandStack.template Top<Frag>(); // Copy constructor to prevent invalidation
        SizeType count = stateCount_ - src.minIndex; // Assumes top operand contains states in [src->minIndex, stateCount_)
        State* s = states_.template Push<State>(count);
        memcpy(s, &GetState(src.minIndex), count * sizeof(State));
        for (SizeType j = 0; j < count; j++) {
            if (s[j].out != kRegexInvalidState)
                s[j].out += count;
            if (s[j].out1 != kRegexInvalidState)
                s[j].out1 += count;
        }
        *operandStack.template Push<Frag>() = Frag(src.start + count, src.out + count, src.minIndex + count);
        stateCount_ += count;
    }